

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

char * __thiscall
stringsearch<std::default_searcher<const_char_*,_std::equal_to<void>_>_>::search
          (stringsearch<std::default_searcher<const_char_*,_std::equal_to<void>_>_> *this,
          char *first,char *last,CallbackType *cb)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_default_searcher<const_char_*,_equal_to<void>_>_>_>
  _Var1;
  bool bVar2;
  reference __t;
  __tuple_element_t<0UL,_tuple<unsigned_long,_default_searcher<const_char_*,_equal_to<void>_>_>_>
  *p_Var3;
  __tuple_element_t<1UL,_tuple<unsigned_long,_default_searcher<const_char_*,_equal_to<void>_>_>_>
  *__searcher;
  char *__args;
  char *f;
  char *p;
  __tuple_element_t<1UL,_tuple<unsigned_long,_default_searcher<const_char_*,_equal_to<void>_>_>_>
  *searcher;
  __tuple_element_t<0UL,_tuple<unsigned_long,_default_searcher<const_char_*,_equal_to<void>_>_>_>
  size;
  tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_> *hp;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>
  *__range2;
  CallbackType *cb_local;
  char *last_local;
  char *first_local;
  stringsearch<std::default_searcher<const_char_*,_std::equal_to<void>_>_> *this_local;
  
  __end0 = std::
           vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>
           ::begin(&this->patterns);
  hp = (tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_> *)
       std::
       vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>
       ::end(&this->patterns);
  do {
    bVar2 = __gnu_cxx::
            operator==<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>_>
                      (&__end0,(__normal_iterator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>_>
                                *)&hp);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return last;
    }
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>_>
          ::operator*(&__end0);
    p_Var3 = std::get<0ul,unsigned_long,std::default_searcher<char_const*,std::equal_to<void>>>(__t)
    ;
    _Var1 = *p_Var3;
    __searcher = std::get<1ul,unsigned_long,std::default_searcher<char_const*,std::equal_to<void>>>
                           (__t);
    f = first;
    while ((f != last &&
           (__args = std::search<char_const*,std::default_searcher<char_const*,std::equal_to<void>>>
                               (f,last,__searcher), __args != last))) {
      bVar2 = std::function<bool_(const_char_*,_const_char_*)>::operator()(cb,__args,__args + _Var1)
      ;
      if (!bVar2) {
        return (char *)0x0;
      }
      f = __args + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>,_std::allocator<std::tuple<unsigned_long,_std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& hp : patterns)
        {
            auto size = std::get<0>(hp);
            auto & searcher = std::get<1>(hp);

            auto p = first;
            while (p != last) {
                auto f = std::search(p, last, searcher);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }